

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O1

void CECoordinates::CIRS2Galactic
               (double input_ra,double input_dec,double *glon,double *glat,CEDate *date,
               CEAngleType *angle_type)

{
  double *pdVar1;
  double ICRS_dec;
  double ICRS_ra;
  CEAngleType local_4c;
  double *local_48;
  double local_40;
  double local_38;
  
  if (*angle_type == DEGREES) {
    input_ra = input_ra * 0.017453292519943295;
    input_dec = input_dec * 0.017453292519943295;
  }
  local_38 = 0.0;
  local_40 = 0.0;
  local_4c = RADIANS;
  local_48 = glat;
  CIRS2ICRS(input_ra,input_dec,&local_38,&local_40,date,&local_4c);
  pdVar1 = local_48;
  local_4c = RADIANS;
  ICRS2Galactic(local_38,local_40,glon,local_48,&local_4c);
  if (*angle_type == DEGREES) {
    *glon = *glon * 57.29577951308232;
    *pdVar1 = *pdVar1 * 57.29577951308232;
  }
  return;
}

Assistant:

void CECoordinates::CIRS2Galactic(double input_ra, double input_dec, double *glon, double *glat,
                                  const CEDate& date, const CEAngleType& angle_type)
{
    // Convert to radians if that's what is passed
    if (angle_type==CEAngleType::DEGREES) {
        input_ra  *= DD2R ;
        input_dec *= DD2R ;
    }
    
    // In order to do this with the sofa package, we must first
    // convert from CIRS -> ICRS
    double ICRS_ra(0.0), ICRS_dec(0.0) ;
    CIRS2ICRS(input_ra, input_dec, &ICRS_ra, &ICRS_dec, date, CEAngleType::RADIANS);
    
    // Now we can convert to galactic
    ICRS2Galactic(ICRS_ra, ICRS_dec, glon, glat, CEAngleType::RADIANS) ;
    
    // Convert to the desired units
    if (angle_type == CEAngleType::DEGREES) {
        *glon *= DR2D ;
        *glat *= DR2D ;
    }
}